

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::isEncrypted(WalletLoaderImpl *this,string *wallet_name)

{
  WalletDatabase *pWVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
  __it;
  long in_FS_OFFSET;
  WalletBatch local_f8;
  WalletDatabase *local_e8;
  DatabaseStatus status;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  wallets;
  shared_ptr<wallet::CWallet> *local_d0;
  bilingual_str error;
  DatabaseOptions local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
              *)&wallets,&this->m_context);
  lVar5 = (long)local_d0 - (long)_wallets;
  __it._M_current = _wallets;
  local_80._0_8_ = wallet_name;
  for (lVar3 = lVar5 >> 6; _Var4._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
            ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                          *)&local_80,__it);
    if (bVar2) goto LAB_00912634;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
            ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                          *)&local_80,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_00912634;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
            ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                          *)&local_80,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_00912634;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
            ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                          *)&local_80,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_00912634;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x40;
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = local_d0;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
                  ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                                *)&local_80,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_00912634;
      _Var4._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
            ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                          *)&local_80,_Var4);
    if (bVar2) goto LAB_00912634;
    __it._M_current = _Var4._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::{lambda(std::shared_ptr<wallet::CWallet>)#1}>
          ::operator()((_Iter_pred<wallet::(anonymous_namespace)::WalletLoaderImpl::isEncrypted(std::__cxx11::string_const&)::_lambda(std::shared_ptr<wallet::CWallet>)_1_>
                        *)&local_80,__it);
  _Var4._M_current = local_d0;
  if (bVar2) {
    _Var4._M_current = __it._M_current;
  }
LAB_00912634:
  if (_Var4._M_current == local_d0) {
    local_80.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
    super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
    local_80.create_flags = 0;
    local_80.create_passphrase._M_dataplus._M_p = (pointer)&local_80.create_passphrase.field_2;
    local_80.create_passphrase._M_string_length = 0;
    local_80.create_passphrase.field_2._M_local_buf[0] = '\0';
    local_80.verify = true;
    local_80.use_unsafe_sync = false;
    local_80.use_shared_memory = false;
    local_80.max_log_mb = 100;
    error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
    error.original._M_string_length = 0;
    local_80._0_2_ = 1;
    error.original.field_2._M_local_buf[0] = '\0';
    error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
    error.translated._M_string_length = 0;
    error.translated.field_2._M_local_buf[0] = '\0';
    MakeWalletDatabase((wallet *)&local_e8,(string *)wallet_name,&local_80,&status,&error);
    pWVar1 = local_e8;
    if (local_e8 == (WalletDatabase *)0x0) {
      bVar2 = false;
    }
    else {
      (*local_e8->_vptr_WalletDatabase[0xe])(&local_f8,local_e8,1);
      local_f8.m_database = pWVar1;
      bVar2 = WalletBatch::IsEncrypted(&local_f8);
      if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
          local_f8.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (DatabaseBatch *)0x0) {
        (*(*(_func_int ***)
            local_f8.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
      if (local_e8 != (WalletDatabase *)0x0) {
        (*local_e8->_vptr_WalletDatabase[1])();
      }
    }
    bilingual_str::~bilingual_str(&error);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
               ((long)&local_80 + 0x18));
  }
  else {
    bVar2 = CWallet::IsCrypted(((_Var4._M_current)->
                               super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
  }
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             *)&wallets);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool isEncrypted(const std::string& wallet_name) override
    {
        auto wallets{GetWallets(m_context)};
        auto it = std::find_if(wallets.begin(), wallets.end(), [&](std::shared_ptr<CWallet> w){ return w->GetName() == wallet_name; });
        if (it != wallets.end()) return (*it)->IsCrypted();

        // Unloaded wallet, read db
        DatabaseOptions options;
        options.require_existing = true;
        DatabaseStatus status;
        bilingual_str error;
        auto db = MakeWalletDatabase(wallet_name, options, status, error);
        if (!db) return false;
        return WalletBatch(*db).IsEncrypted();
    }